

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_ecmult_multi_tests(void)

{
  int iVar1;
  secp256k1_callback *error_callback;
  secp256k1_scratch *size;
  secp256k1_callback *unaff_retaddr;
  int64_t todo;
  secp256k1_scratch *scratch;
  secp256k1_ecmult_multi_func in_stack_00000120;
  secp256k1_ecmult_multi_func in_stack_00001968;
  secp256k1_scratch *in_stack_00001970;
  secp256k1_scratch *in_stack_000094a0;
  secp256k1_scratch *in_stack_ffffffffffffffe8;
  secp256k1_scratch *scratch_00;
  size_t in_stack_fffffffffffffff8;
  
  error_callback = (secp256k1_callback *)((long)COUNT * 0x140);
  test_secp256k1_pippenger_bucket_window_inv();
  test_ecmult_multi_pippenger_max_points();
  size = secp256k1_scratch_create(unaff_retaddr,in_stack_fffffffffffffff8);
  test_ecmult_multi(in_stack_00001970,in_stack_00001968);
  test_ecmult_multi(in_stack_00001970,in_stack_00001968);
  test_ecmult_multi(in_stack_00001970,in_stack_00001968);
  test_ecmult_multi_batch_single(in_stack_00000120);
  test_ecmult_multi(in_stack_00001970,in_stack_00001968);
  test_ecmult_multi_batch_single(in_stack_00000120);
  for (; 0 < (long)error_callback;
      error_callback = (secp256k1_callback *)((long)error_callback - (long)iVar1)) {
    iVar1 = test_ecmult_multi_random(in_stack_000094a0);
  }
  secp256k1_scratch_destroy(error_callback,in_stack_ffffffffffffffe8);
  scratch_00 = (secp256k1_scratch *)&CTX->error_callback;
  secp256k1_strauss_scratch_size(1);
  secp256k1_scratch_create(unaff_retaddr,(size_t)size);
  test_ecmult_multi(in_stack_00001970,in_stack_00001968);
  secp256k1_scratch_destroy(error_callback,scratch_00);
  test_ecmult_multi_batch_size_helper();
  test_ecmult_multi_batching();
  return;
}

Assistant:

static void run_ecmult_multi_tests(void) {
    secp256k1_scratch *scratch;
    int64_t todo = (int64_t)320 * COUNT;

    test_secp256k1_pippenger_bucket_window_inv();
    test_ecmult_multi_pippenger_max_points();
    scratch = secp256k1_scratch_create(&CTX->error_callback, 819200);
    test_ecmult_multi(scratch, secp256k1_ecmult_multi_var);
    test_ecmult_multi(NULL, secp256k1_ecmult_multi_var);
    test_ecmult_multi(scratch, secp256k1_ecmult_pippenger_batch_single);
    test_ecmult_multi_batch_single(secp256k1_ecmult_pippenger_batch_single);
    test_ecmult_multi(scratch, secp256k1_ecmult_strauss_batch_single);
    test_ecmult_multi_batch_single(secp256k1_ecmult_strauss_batch_single);
    while (todo > 0) {
        todo -= test_ecmult_multi_random(scratch);
    }
    secp256k1_scratch_destroy(&CTX->error_callback, scratch);

    /* Run test_ecmult_multi with space for exactly one point */
    scratch = secp256k1_scratch_create(&CTX->error_callback, secp256k1_strauss_scratch_size(1) + STRAUSS_SCRATCH_OBJECTS*ALIGNMENT);
    test_ecmult_multi(scratch, secp256k1_ecmult_multi_var);
    secp256k1_scratch_destroy(&CTX->error_callback, scratch);

    test_ecmult_multi_batch_size_helper();
    test_ecmult_multi_batching();
}